

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall RandomBotStrategy::attackMaxDice(RandomBotStrategy *this)

{
  int iVar1;
  result_type_conflict rVar2;
  uniform_int_distribution<int> dis;
  param_type local_8;
  
  iVar1 = *((this->super_PlayerStrategy).from)->pNumberOfTroops;
  local_8._M_b = 3;
  if (iVar1 < 4) {
    local_8._M_b = (iVar1 == 3) + 1;
  }
  local_8._M_a = 1;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_8,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008,&local_8);
  return rVar2;
}

Assistant:

int RandomBotStrategy::attackMaxDice(std::mt19937 gen) {
    int maxDice = 1;
    if (from->getNumberOfTroops() > 3) {
        maxDice = 3;
    }
    else if (from->getNumberOfTroops() == 3) {
        maxDice = 2;
    }
    std::uniform_int_distribution<> dis(1, maxDice);
    return dis(gen);
}